

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O3

wheelchair_accessible_t parse_wheelchair_accessibility(char *value)

{
  byte bVar1;
  
  bVar1 = *value;
  if (bVar1 < 0x31) {
    if (bVar1 == 0) {
      return (uint)bVar1;
    }
    if (bVar1 == 0x30) {
      return (uint)(value[1] != '\0') * 3;
    }
  }
  else {
    if (bVar1 == 0x31) {
      return (uint)(value[1] != '\0') * 2 + WA_POSSIBLE;
    }
    if (bVar1 == 0x32) {
      return WA_NOT_SET - (value[1] == '\0');
    }
  }
  return WA_NOT_SET;
}

Assistant:

wheelchair_accessible_t parse_wheelchair_accessibility(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return WA_UNKNOWN;
    else if (strcmp(value, "1") == 0)
        return WA_POSSIBLE;
    else if (strcmp(value, "2") == 0)
        return WA_NOT_POSSIBLE;
    else
        return WA_NOT_SET;
}